

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddIte.c
# Opt level: O0

DdNode * Cudd_addEvalConst(DdManager *dd,DdNode *f,DdNode *g)

{
  DdNode *pDVar1;
  DdManager *pDVar2;
  uint local_78;
  uint local_74;
  uint topg;
  uint topf;
  DdNode *e;
  DdNode *t;
  DdNode *r;
  DdNode *Gnv;
  DdNode *Gv;
  DdNode *Fnv;
  DdNode *Fv;
  DdNode *zero;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)g;
  if ((f != dd->one) && (g->index != 0x7fffffff)) {
    pDVar1 = dd->zero;
    if (f == pDVar1) {
      dd_local = (DdManager *)dd->background;
    }
    else {
      if (f->index == 0x7fffffff) {
        local_74 = f->index;
      }
      else {
        local_74 = dd->perm[f->index];
      }
      if (g->index == 0x7fffffff) {
        local_78 = g->index;
      }
      else {
        local_78 = dd->perm[g->index];
      }
      dd_local = (DdManager *)cuddConstantLookup(dd,0x66,f,g,g);
      if (dd_local == (DdManager *)0x0) {
        Gv = f;
        Fnv = f;
        if (local_74 <= local_78) {
          Fnv = (f->type).kids.T;
          Gv = (f->type).kids.E;
        }
        r = g;
        Gnv = g;
        if (local_78 <= local_74) {
          Gnv = (g->type).kids.T;
          r = (g->type).kids.E;
        }
        if (Fnv == pDVar1) {
          dd_local = (DdManager *)Cudd_addEvalConst(dd,Gv,r);
          cuddCacheInsert2(dd,Cudd_addEvalConst,f,g,(DdNode *)dd_local);
        }
        else {
          dd_local = (DdManager *)Cudd_addEvalConst(dd,Fnv,Gnv);
          if ((dd_local == (DdManager *)0x1) || ((dd_local->sentinel).index != 0x7fffffff)) {
            cuddCacheInsert2(dd,Cudd_addEvalConst,f,g,(DdNode *)0x1);
            dd_local = (DdManager *)0x1;
          }
          else if ((Gv == pDVar1) ||
                  (((pDVar2 = (DdManager *)Cudd_addEvalConst(dd,Gv,r), pDVar2 != (DdManager *)0x1 &&
                    ((pDVar2->sentinel).index == 0x7fffffff)) && (dd_local == pDVar2)))) {
            cuddCacheInsert2(dd,Cudd_addEvalConst,f,g,(DdNode *)dd_local);
          }
          else {
            cuddCacheInsert2(dd,Cudd_addEvalConst,f,g,(DdNode *)0x1);
            dd_local = (DdManager *)0x1;
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addEvalConst(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *zero;
    DdNode *Fv,*Fnv,*Gv,*Gnv,*r,*t,*e;
    unsigned int topf,topg;

#ifdef DD_DEBUG
    assert(!Cudd_IsComplement(f));
#endif

    statLine(dd);
    /* Terminal cases. */
    if (f == DD_ONE(dd) || cuddIsConstant(g)) {
        return(g);
    }
    if (f == (zero = DD_ZERO(dd))) {
        return(dd->background);
    }

#ifdef DD_DEBUG
    assert(!cuddIsConstant(f));
#endif
    /* From now on, f and g are known not to be constants. */

    topf = cuddI(dd,f->index);
    topg = cuddI(dd,g->index);

    /* Check cache. */
    r = cuddConstantLookup(dd,DD_ADD_EVAL_CONST_TAG,f,g,g);
    if (r != NULL) {
        return(r);
    }

    /* Compute cofactors. */
    if (topf <= topg) {
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }
    if (topg <= topf) {
        Gv = cuddT(g); Gnv = cuddE(g);
    } else {
        Gv = Gnv = g;
    }
    
    /* Recursive step. */
    if (Fv != zero) {
        t = Cudd_addEvalConst(dd,Fv,Gv);
        if (t == DD_NON_CONSTANT || !cuddIsConstant(t)) {
            cuddCacheInsert2(dd, Cudd_addEvalConst, f, g, DD_NON_CONSTANT);
            return(DD_NON_CONSTANT);
        }
        if (Fnv != zero) {
            e = Cudd_addEvalConst(dd,Fnv,Gnv);
            if (e == DD_NON_CONSTANT || !cuddIsConstant(e) || t != e) {
                cuddCacheInsert2(dd, Cudd_addEvalConst, f, g, DD_NON_CONSTANT);
                return(DD_NON_CONSTANT);
            }
        }
        cuddCacheInsert2(dd,Cudd_addEvalConst,f,g,t);
        return(t);
    } else { /* Fnv must be != zero */
        e = Cudd_addEvalConst(dd,Fnv,Gnv);
        cuddCacheInsert2(dd, Cudd_addEvalConst, f, g, e);
        return(e);
    }

}